

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O1

void __thiscall ELFIO::elfio::elfio(elfio *this)

{
  (this->sections).parent = this;
  (this->segments).parent = this;
  (this->pstream)._M_t.
  super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (basic_ifstream<char,_std::char_traits<char>_> *)0x0;
  (this->header)._M_t.
  super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
  super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
  super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl = (elf_header *)0x0;
  (this->sections_).
  super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sections_).
  super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sections_).
  super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->segments_).
  super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->segments_).
  super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->segments_).
  super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->convertor).need_conversion = false;
  (this->addr_translator).addr_translations.
  super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->addr_translator).addr_translations.
  super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->addr_translator).addr_translations.
  super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->compression).super___shared_ptr<ELFIO::compression_interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->compression).super___shared_ptr<ELFIO::compression_interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->current_file_pos = 0;
  create(this,'\x01','\x01');
  return;
}

Assistant:

elfio() noexcept : sections( this ), segments( this )
    {
        create( ELFCLASS32, ELFDATA2LSB );
    }